

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O0

nullres nullcSetFunction(char *name,NULLCFuncPtr func)

{
  uint index_00;
  ExternFuncInfo *pEVar1;
  uint index;
  char *name_local;
  NULLCFuncPtr func_local;
  
  if ((NULLC::initialized & 1) == 0) {
    NULLC::nullcLastError = "ERROR: NULLC is not initialized";
    func_local.context._7_1_ = '\0';
  }
  else {
    index_00 = nullcFindFunctionIndex(name);
    if (index_00 == 0xffffffff) {
      func_local.context._7_1_ = '\0';
    }
    else {
      pEVar1 = FastVector<ExternFuncInfo,_false,_false>::operator[]
                         ((FastVector<ExternFuncInfo,_false,_false> *)(NULLC::linker + 0x240),
                          func.id);
      if (pEVar1->funcCat == '\0') {
        pEVar1 = FastVector<ExternFuncInfo,_false,_false>::operator[]
                           ((FastVector<ExternFuncInfo,_false,_false> *)(NULLC::linker + 0x240),
                            index_00);
        if (pEVar1->builtinIndex == 0) {
          func_local.context._7_1_ = nullcRedirectFunction(index_00,func.id);
        }
        else {
          NULLC::nullcLastError = "ERROR: can\'t override builtin function";
          func_local.context._7_1_ = '\0';
        }
      }
      else {
        NULLC::nullcLastError = "ERROR: source function uses context, which is unavailable";
        func_local.context._7_1_ = '\0';
      }
    }
  }
  return func_local.context._7_1_;
}

Assistant:

nullres nullcSetFunction(const char* name, NULLCFuncPtr func)
{
	using namespace NULLC;
	NULLC_CHECK_INITIALIZED(false);

	unsigned index = nullcFindFunctionIndex(name);
	if(index == ~0u)
		return false;

	if(linker->exFunctions[func.id].funcCat != ExternFuncInfo::NORMAL)
	{
		nullcLastError = "ERROR: source function uses context, which is unavailable";
		return false;
	}

	if(linker->exFunctions[index].builtinIndex != 0)
	{
		nullcLastError = "ERROR: can't override builtin function";
		return false;
	}

	return nullcRedirectFunction(index, func.id);
}